

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zm.c
# Opt level: O0

void zmSqr(word *b,word *a,qr_o *r,void *stack)

{
  word *in_RCX;
  word *in_RDX;
  word *in_RSI;
  word *in_RDI;
  word *prod;
  word *n;
  
  n = in_RCX + in_RDX[6] * 2;
  zzSqr(b,a,(size_t)r,stack);
  zzRed(in_RSI,in_RDX,(size_t)n,in_RCX);
  wwCopy(in_RDI,in_RCX,in_RDX[6]);
  return;
}

Assistant:

static void zmSqr(word b[], const word a[], const qr_o* r, void* stack)
{
	word* prod = (word*)stack;
	ASSERT(zmIsOperable(r));
	ASSERT(zmIsIn(a, r));
	stack = prod + 2 * r->n;
	zzSqr(prod, a, r->n, stack);
	zzRed(prod, r->mod, r->n, stack);
	wwCopy(b, prod, r->n);
}